

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectator.cpp
# Opt level: O0

void CSpectator::ConKeySpectator(IResult *pResult,void *pUserData)

{
  int iVar1;
  IClient *this;
  IDemoPlayer *pIVar2;
  long in_RSI;
  long *in_RDI;
  CSpectator *pSelf;
  
  if ((*(byte *)(*(long *)(in_RSI + 8) + 0x1628) & 1) != 0) {
    this = CComponent::Client((CComponent *)0x1c2dd5);
    iVar1 = IClient::State(this);
    if (iVar1 == 4) {
      pIVar2 = CComponent::DemoPlayer((CComponent *)0x1c2deb);
      iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[10])();
      if (iVar1 != 2) {
        return;
      }
    }
    iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,0);
    *(bool *)(in_RSI + 0x10) = iVar1 != 0;
  }
  return;
}

Assistant:

void CSpectator::ConKeySpectator(IConsole::IResult *pResult, void *pUserData)
{
	CSpectator *pSelf = (CSpectator *)pUserData;
	if(pSelf->m_pClient->m_Snap.m_SpecInfo.m_Active &&
		(pSelf->Client()->State() != IClient::STATE_DEMOPLAYBACK || pSelf->DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER))
		pSelf->m_Active = pResult->GetInteger(0) != 0;
}